

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::BlindRawTransactionRequest::BlindRawTransactionRequest
          (BlindRawTransactionRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_39 [9];
  
  (this->super_JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__BlindRawTransactionRequest_00b42510;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->tx_,"",local_39);
  (this->txins_).super_JsonVector<cfd::js::api::json::BlindTxInRequest>.
  super_vector<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::BlindTxInRequest>.
  super_vector<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::BlindTxInRequest>.
  super_vector<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::BlindTxInRequest>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b425a8;
  (this->txouts_).super_JsonVector<cfd::js::api::json::BlindTxOutRequest>.
  super_vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::BlindTxOutRequest>.
  super_vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::BlindTxOutRequest>.
  super_vector<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindTxOutRequest,_std::allocator<cfd::js::api::json::BlindTxOutRequest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::BlindTxOutRequest>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b426f0;
  (this->txout_confidential_addresses_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txout_confidential_addresses_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txout_confidential_addresses_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txout_confidential_addresses_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_JsonVector = (_func_int **)&PTR__JsonVector_00b37210;
  (this->issuances_).super_JsonVector<cfd::js::api::json::BlindIssuanceRequest>.
  super_vector<cfd::js::api::json::BlindIssuanceRequest,_std::allocator<cfd::js::api::json::BlindIssuanceRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindIssuanceRequest,_std::allocator<cfd::js::api::json::BlindIssuanceRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->issuances_).super_JsonVector<cfd::js::api::json::BlindIssuanceRequest>.
  super_vector<cfd::js::api::json::BlindIssuanceRequest,_std::allocator<cfd::js::api::json::BlindIssuanceRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindIssuanceRequest,_std::allocator<cfd::js::api::json::BlindIssuanceRequest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->issuances_).super_JsonVector<cfd::js::api::json::BlindIssuanceRequest>.
  super_vector<cfd::js::api::json::BlindIssuanceRequest,_std::allocator<cfd::js::api::json::BlindIssuanceRequest>_>
  .
  super__Vector_base<cfd::js::api::json::BlindIssuanceRequest,_std::allocator<cfd::js::api::json::BlindIssuanceRequest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->issuances_).super_JsonVector<cfd::js::api::json::BlindIssuanceRequest>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b42838;
  this->minimum_range_value_ = 1;
  this->exponent_ = 0;
  this->minimum_bits_ = 0x34;
  this->collect_blinder_ = false;
  CollectFieldName();
  return;
}

Assistant:

BlindRawTransactionRequest() {
    CollectFieldName();
  }